

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings.cpp
# Opt level: O0

ReadStatus __thiscall
PartiallyDownloadedBlock::InitData
          (PartiallyDownloadedBlock *this,CBlockHeaderAndShortTxIDs *cmpctblock,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *extra_txn)

{
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  unsigned_short uVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  reference psVar8;
  char *pcVar9;
  size_type sVar10;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  reference rVar11;
  size_t i_2;
  shared_ptr<const_CTransaction> *tx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1;
  size_t i_1;
  uint16_t index_offset;
  size_t i;
  int32_t lastprefilledindex;
  iterator idit_1;
  uint64_t shortid_1;
  iterator idit;
  uint64_t shortid;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
  shorttxids;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  vector<bool,_std::allocator<bool>_> have_txn;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  CBlockHeaderAndShortTxIDs *in_stack_fffffffffffffc90;
  CBlockHeaderAndShortTxIDs *in_stack_fffffffffffffc98;
  Wtxid *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  char *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffcc0;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  const_reference in_stack_fffffffffffffcf0;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false>
  *in_stack_fffffffffffffcf8;
  int source_line;
  ConstevalFormatString<2U> in_stack_fffffffffffffd38;
  char *in_stack_fffffffffffffd48;
  reference in_stack_fffffffffffffd50;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false>
  *in_stack_fffffffffffffd58;
  Level level;
  ulong uVar12;
  ulong uVar13;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  ulong local_1b0;
  short local_1a6;
  ulong local_198;
  uint local_18c;
  ReadStatus local_16c;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false> local_118;
  uint64_t local_110;
  reference local_108;
  reference local_f8;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false> local_e8;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false> local_e0;
  uint64_t local_d8;
  shared_ptr<const_CTransaction> *local_d0;
  shared_ptr<const_CTransaction> *local_c8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CBlockHeader::IsNull
                    ((CBlockHeader *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  if ((bVar1) ||
     ((bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffc98), bVar1 &&
      (bVar1 = std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::empty
                         ((vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *)
                          in_stack_fffffffffffffc98), bVar1)))) {
    local_16c = READ_STATUS_INVALID;
  }
  else {
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    sVar4 = std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::size
                      ((vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    if (sVar3 + sVar4 < 0x186a1) {
      bVar1 = CBlockHeader::IsNull
                        ((CBlockHeader *)
                         CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      if ((bVar1) &&
         (bVar1 = std::
                  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ::empty((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           *)in_stack_fffffffffffffc98), bVar1)) {
        memcpy((void *)(in_RDI + 0x38),(void *)(in_RSI + 0x48),0x50);
        CBlockHeaderAndShortTxIDs::BlockTxCount(in_stack_fffffffffffffc98);
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::resize((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                 (size_type)in_stack_fffffffffffffca0);
        local_18c = 0xffffffff;
        for (local_198 = 0;
            sVar3 = std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::size
                              ((vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>
                                *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)),
            local_198 < sVar3; local_198 = local_198 + 1) {
          std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::operator[]
                    ((vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *)
                     in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          bVar1 = CTransaction::IsNull((CTransaction *)in_stack_fffffffffffffc98);
          if (bVar1) {
            local_16c = READ_STATUS_INVALID;
            goto LAB_008b8eee;
          }
          pvVar5 = std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::
                   operator[]((vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *
                              )in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
          local_18c = pvVar5->index + 1 + local_18c;
          uVar2 = std::numeric_limits<unsigned_short>::max();
          if ((int)(uint)uVar2 < (int)local_18c) {
            local_16c = READ_STATUS_INVALID;
            goto LAB_008b8eee;
          }
          sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          if (sVar3 + local_198 < (ulong)local_18c) {
            local_16c = READ_STATUS_INVALID;
            goto LAB_008b8eee;
          }
          std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::operator[]
                    ((vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *)
                     in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
          std::shared_ptr<const_CTransaction>::operator=
                    ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffc98,
                     (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffc90);
        }
        sVar3 = std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::size
                          ((vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *)
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        *(size_type *)(in_RDI + 0x18) = sVar3;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>::allocator
                  ((allocator<std::pair<const_unsigned_long,_unsigned_short>_> *)
                   CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        std::
        unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
        ::unordered_map((unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                         *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                        (size_type)in_stack_fffffffffffffca0,(hasher *)in_stack_fffffffffffffc98,
                        (key_equal *)in_stack_fffffffffffffc90,
                        (allocator_type *)
                        CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>::~allocator
                  ((allocator<std::pair<const_unsigned_long,_unsigned_short>_> *)
                   CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        local_1a6 = 0;
        for (local_1b0 = 0;
            sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)),
            local_1b0 < sVar3; local_1b0 = local_1b0 + 1) {
          while( true ) {
            std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          *)in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
            bVar1 = std::__shared_ptr::operator_cast_to_bool
                              ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            if (!bVar1) break;
            local_1a6 = local_1a6 + 1;
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
          pmVar6 = std::
                   unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                   ::operator[]((unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                                 *)in_stack_fffffffffffffc98,&in_stack_fffffffffffffc90->shorttxidk0
                               );
          *pmVar6 = (short)local_1b0 + local_1a6;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
          std::
          unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
          ::bucket((unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                    *)in_stack_fffffffffffffc98,&in_stack_fffffffffffffc90->shorttxidk0);
          sVar7 = std::
                  unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                  ::bucket_size((unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                                 *)in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
          if (0xc < sVar7) {
            local_16c = READ_STATUS_FAILED;
            goto LAB_008b8ed0;
          }
        }
        sVar7 = std::
                unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                ::size((unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        if (sVar7 == sVar3) {
          std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          std::allocator<bool>::allocator
                    ((allocator<bool> *)
                     CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          std::vector<bool,_std::allocator<bool>_>::vector
                    ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc90,
                     CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                     (allocator_type *)0x8b85a3);
          std::allocator<bool>::~allocator
                    ((allocator<bool> *)
                     CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                    ((AnnotatedMixin<std::recursive_mutex> *)
                     CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                    ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                     CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8),
                     in_stack_fffffffffffffcc0,
                     (char *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                     in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                     SUB41((uint)in_stack_fffffffffffffca8 >> 0x18,0));
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)(in_RDI + 0x30) + 0x138);
          local_c8 = (shared_ptr<const_CTransaction> *)
                     std::
                     vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              *)in_stack_fffffffffffffc90);
          local_d0 = (shared_ptr<const_CTransaction> *)
                     std::
                     vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)in_stack_fffffffffffffc90);
          while( true ) {
            bVar1 = __gnu_cxx::
                    operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                              ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                *)in_stack_fffffffffffffc98,
                               (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                *)in_stack_fffffffffffffc90);
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            psVar8 = __gnu_cxx::
                     __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                     ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            CTransaction::GetWitnessHash
                      ((CTransaction *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)
                      );
            local_d8 = CBlockHeaderAndShortTxIDs::GetShortID
                                 ((CBlockHeaderAndShortTxIDs *)
                                  CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                                  in_stack_fffffffffffffca0);
            local_e0._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                 ::find((unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                         *)in_stack_fffffffffffffc90,
                        (key_type *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            local_e8._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                 ::end((unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                        *)in_stack_fffffffffffffc90);
            bVar1 = std::__detail::operator==
                              ((_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false>
                                *)in_stack_fffffffffffffc98,
                               (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false>
                                *)in_stack_fffffffffffffc90);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              std::__detail::
              _Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>::
              operator->((_Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>
                          *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
              rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc98,
                                  (size_type)in_stack_fffffffffffffc90);
              local_f8 = rVar11;
              bVar1 = std::_Bit_reference::operator_cast_to_bool
                                ((_Bit_reference *)
                                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                std::__detail::
                _Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>::
                operator->((_Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>
                            *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                std::
                vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              *)in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
                bVar1 = std::__shared_ptr::operator_cast_to_bool
                                  ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                                   CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                if (bVar1) {
                  std::__detail::
                  _Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>::
                  operator->((_Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>
                              *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                  std::
                  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                *)in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
                  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::reset
                            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                             in_stack_fffffffffffffc98);
                  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
                }
              }
              else {
                in_stack_fffffffffffffd58 = &local_e0;
                std::__detail::
                _Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>::
                operator->((_Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>
                            *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                std::
                vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                              *)in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
                std::shared_ptr<const_CTransaction>::operator=
                          ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffc98,
                           (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffc90);
                std::__detail::
                _Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>::
                operator->((_Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>
                            *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc98
                                    ,(size_type)in_stack_fffffffffffffc90);
                local_108 = rVar11;
                std::_Bit_reference::operator=
                          ((_Bit_reference *)in_stack_fffffffffffffc98,
                           SUB81((ulong)in_stack_fffffffffffffc90 >> 0x38,0));
                *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 1;
                in_stack_fffffffffffffd50 = psVar8;
              }
            }
            in_stack_fffffffffffffd48 = *(char **)(in_RDI + 0x20);
            pcVar9 = (char *)std::
                             unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                             ::size((unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88)
                                   );
            if (in_stack_fffffffffffffd48 == pcVar9) break;
            __gnu_cxx::
            __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
            ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          }
          UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                    ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                     CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          uVar12 = 0;
          while( true ) {
            uVar13 = uVar12;
            sVar3 = std::
                    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
            source_line = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
            if (sVar3 <= uVar12) break;
            std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          *)in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
            bVar1 = std::operator==((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffc98,
                                    in_stack_fffffffffffffc90);
            if (!bVar1) {
              std::
              vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
              std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
              in_stack_fffffffffffffd38.fmt =
                   (char *)CTransaction::GetWitnessHash
                                     ((CTransaction *)
                                      CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88))
              ;
              local_110 = CBlockHeaderAndShortTxIDs::GetShortID
                                    ((CBlockHeaderAndShortTxIDs *)
                                     CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                                     in_stack_fffffffffffffca0);
              local_118._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                   ::find((unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                           *)in_stack_fffffffffffffc90,
                          (key_type *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88))
              ;
              std::
              unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
              ::end((unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                     *)in_stack_fffffffffffffc90);
              bVar1 = std::__detail::operator==
                                ((_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false>
                                  *)in_stack_fffffffffffffc98,
                                 (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_short>,_false>
                                  *)in_stack_fffffffffffffc90);
              if (((bVar1 ^ 0xffU) & 1) != 0) {
                std::__detail::
                _Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>::
                operator->((_Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>
                            *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc98,
                           (size_type)in_stack_fffffffffffffc90);
                bVar1 = std::_Bit_reference::operator_cast_to_bool
                                  ((_Bit_reference *)
                                   CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  std::__detail::
                  _Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>::
                  operator->((_Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>
                              *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                  std::
                  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                *)in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
                  bVar1 = std::__shared_ptr::operator_cast_to_bool
                                    ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *
                                     )CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88))
                  ;
                  if (bVar1) {
                    std::__detail::
                    _Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>::
                    operator->((_Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>
                                *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                    std::
                    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                  *)in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
                    std::
                    __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                    CTransaction::GetWitnessHash
                              ((CTransaction *)
                               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                    std::
                    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                  *)in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
                    std::
                    __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                    CTransaction::GetWitnessHash
                              ((CTransaction *)
                               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                    bVar1 = transaction_identifier<true>::operator!=
                                      ((transaction_identifier<true> *)in_stack_fffffffffffffc98,
                                       (transaction_identifier<true> *)in_stack_fffffffffffffc90);
                    if (bVar1) {
                      std::__detail::
                      _Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>::
                      operator->((_Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>
                                  *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                      std::
                      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                    *)in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90
                                  );
                      std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::reset
                                ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                                 in_stack_fffffffffffffc98);
                      *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
                      *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + -1;
                    }
                  }
                }
                else {
                  in_stack_fffffffffffffcf0 =
                       std::
                       vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                     *)in_stack_fffffffffffffc98,
                                    (size_type)in_stack_fffffffffffffc90);
                  in_stack_fffffffffffffcf8 = &local_118;
                  std::__detail::
                  _Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>::
                  operator->((_Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>
                              *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                  std::
                  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                *)in_stack_fffffffffffffc98,(size_type)in_stack_fffffffffffffc90);
                  std::shared_ptr<const_CTransaction>::operator=
                            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffc98,
                             (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffc90);
                  std::__detail::
                  _Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>::
                  operator->((_Node_iterator<std::pair<const_unsigned_long,_unsigned_short>,_false,_false>
                              *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
                  std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc98,
                             (size_type)in_stack_fffffffffffffc90);
                  std::_Bit_reference::operator=
                            ((_Bit_reference *)in_stack_fffffffffffffc98,
                             SUB81((ulong)in_stack_fffffffffffffc90 >> 0x38,0));
                  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 1;
                  *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
                }
              }
              sVar7 = *(size_type *)(in_RDI + 0x20);
              sVar10 = std::
                       unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                       ::size((unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
              source_line = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
              if (sVar7 == sVar10) break;
            }
            uVar12 = uVar13 + 1;
          }
          level = (Level)uVar13;
          bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                                      Trace);
          if (bVar1) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                       (char *)in_stack_fffffffffffffca0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                       (char *)in_stack_fffffffffffffca0);
            CBlockHeader::GetHash
                      ((CBlockHeader *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)
                      );
            base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffc90);
            GetSerializeSize<CBlockHeaderAndShortTxIDs>(in_stack_fffffffffffffc90);
            in_stack_fffffffffffffc88 = 1;
            logging_function._M_str = (char *)in_stack_fffffffffffffd58;
            logging_function._M_len = (size_t)in_stack_fffffffffffffd50;
            source_file._M_str = in_stack_fffffffffffffd48;
            source_file._M_len = uVar12;
            LogPrintFormatInternal<std::__cxx11::string,unsigned_long>
                      (logging_function,source_file,source_line,(LogFlags)in_stack_fffffffffffffcf0,
                       level,in_stack_fffffffffffffd38,args,
                       (unsigned_long *)
                       CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
          }
          local_16c = READ_STATUS_OK;
          std::vector<bool,_std::allocator<bool>_>::~vector
                    ((vector<bool,_std::allocator<bool>_> *)
                     CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
        }
        else {
          local_16c = READ_STATUS_FAILED;
        }
LAB_008b8ed0:
        std::
        unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
        ::~unordered_map((unordered_map<unsigned_long,_unsigned_short,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_short>_>_>
                          *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      }
      else {
        local_16c = READ_STATUS_INVALID;
      }
    }
    else {
      local_16c = READ_STATUS_INVALID;
    }
  }
LAB_008b8eee:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_16c;
}

Assistant:

ReadStatus PartiallyDownloadedBlock::InitData(const CBlockHeaderAndShortTxIDs& cmpctblock, const std::vector<CTransactionRef>& extra_txn) {
    if (cmpctblock.header.IsNull() || (cmpctblock.shorttxids.empty() && cmpctblock.prefilledtxn.empty()))
        return READ_STATUS_INVALID;
    if (cmpctblock.shorttxids.size() + cmpctblock.prefilledtxn.size() > MAX_BLOCK_WEIGHT / MIN_SERIALIZABLE_TRANSACTION_WEIGHT)
        return READ_STATUS_INVALID;

    if (!header.IsNull() || !txn_available.empty()) return READ_STATUS_INVALID;

    header = cmpctblock.header;
    txn_available.resize(cmpctblock.BlockTxCount());

    int32_t lastprefilledindex = -1;
    for (size_t i = 0; i < cmpctblock.prefilledtxn.size(); i++) {
        if (cmpctblock.prefilledtxn[i].tx->IsNull())
            return READ_STATUS_INVALID;

        lastprefilledindex += cmpctblock.prefilledtxn[i].index + 1; //index is a uint16_t, so can't overflow here
        if (lastprefilledindex > std::numeric_limits<uint16_t>::max())
            return READ_STATUS_INVALID;
        if ((uint32_t)lastprefilledindex > cmpctblock.shorttxids.size() + i) {
            // If we are inserting a tx at an index greater than our full list of shorttxids
            // plus the number of prefilled txn we've inserted, then we have txn for which we
            // have neither a prefilled txn or a shorttxid!
            return READ_STATUS_INVALID;
        }
        txn_available[lastprefilledindex] = cmpctblock.prefilledtxn[i].tx;
    }
    prefilled_count = cmpctblock.prefilledtxn.size();

    // Calculate map of txids -> positions and check mempool to see what we have (or don't)
    // Because well-formed cmpctblock messages will have a (relatively) uniform distribution
    // of short IDs, any highly-uneven distribution of elements can be safely treated as a
    // READ_STATUS_FAILED.
    std::unordered_map<uint64_t, uint16_t> shorttxids(cmpctblock.shorttxids.size());
    uint16_t index_offset = 0;
    for (size_t i = 0; i < cmpctblock.shorttxids.size(); i++) {
        while (txn_available[i + index_offset])
            index_offset++;
        shorttxids[cmpctblock.shorttxids[i]] = i + index_offset;
        // To determine the chance that the number of entries in a bucket exceeds N,
        // we use the fact that the number of elements in a single bucket is
        // binomially distributed (with n = the number of shorttxids S, and p =
        // 1 / the number of buckets), that in the worst case the number of buckets is
        // equal to S (due to std::unordered_map having a default load factor of 1.0),
        // and that the chance for any bucket to exceed N elements is at most
        // buckets * (the chance that any given bucket is above N elements).
        // Thus: P(max_elements_per_bucket > N) <= S * (1 - cdf(binomial(n=S,p=1/S), N)).
        // If we assume blocks of up to 16000, allowing 12 elements per bucket should
        // only fail once per ~1 million block transfers (per peer and connection).
        if (shorttxids.bucket_size(shorttxids.bucket(cmpctblock.shorttxids[i])) > 12)
            return READ_STATUS_FAILED;
    }
    // TODO: in the shortid-collision case, we should instead request both transactions
    // which collided. Falling back to full-block-request here is overkill.
    if (shorttxids.size() != cmpctblock.shorttxids.size())
        return READ_STATUS_FAILED; // Short ID collision

    std::vector<bool> have_txn(txn_available.size());
    {
    LOCK(pool->cs);
    for (const auto& tx : pool->txns_randomized) {
        uint64_t shortid = cmpctblock.GetShortID(tx->GetWitnessHash());
        std::unordered_map<uint64_t, uint16_t>::iterator idit = shorttxids.find(shortid);
        if (idit != shorttxids.end()) {
            if (!have_txn[idit->second]) {
                txn_available[idit->second] = tx;
                have_txn[idit->second]  = true;
                mempool_count++;
            } else {
                // If we find two mempool txn that match the short id, just request it.
                // This should be rare enough that the extra bandwidth doesn't matter,
                // but eating a round-trip due to FillBlock failure would be annoying
                if (txn_available[idit->second]) {
                    txn_available[idit->second].reset();
                    mempool_count--;
                }
            }
        }
        // Though ideally we'd continue scanning for the two-txn-match-shortid case,
        // the performance win of an early exit here is too good to pass up and worth
        // the extra risk.
        if (mempool_count == shorttxids.size())
            break;
    }
    }

    for (size_t i = 0; i < extra_txn.size(); i++) {
        if (extra_txn[i] == nullptr) {
            continue;
        }
        uint64_t shortid = cmpctblock.GetShortID(extra_txn[i]->GetWitnessHash());
        std::unordered_map<uint64_t, uint16_t>::iterator idit = shorttxids.find(shortid);
        if (idit != shorttxids.end()) {
            if (!have_txn[idit->second]) {
                txn_available[idit->second] = extra_txn[i];
                have_txn[idit->second]  = true;
                mempool_count++;
                extra_count++;
            } else {
                // If we find two mempool/extra txn that match the short id, just
                // request it.
                // This should be rare enough that the extra bandwidth doesn't matter,
                // but eating a round-trip due to FillBlock failure would be annoying
                // Note that we don't want duplication between extra_txn and mempool to
                // trigger this case, so we compare witness hashes first
                if (txn_available[idit->second] &&
                        txn_available[idit->second]->GetWitnessHash() != extra_txn[i]->GetWitnessHash()) {
                    txn_available[idit->second].reset();
                    mempool_count--;
                    extra_count--;
                }
            }
        }
        // Though ideally we'd continue scanning for the two-txn-match-shortid case,
        // the performance win of an early exit here is too good to pass up and worth
        // the extra risk.
        if (mempool_count == shorttxids.size())
            break;
    }

    LogDebug(BCLog::CMPCTBLOCK, "Initialized PartiallyDownloadedBlock for block %s using a cmpctblock of size %lu\n", cmpctblock.header.GetHash().ToString(), GetSerializeSize(cmpctblock));

    return READ_STATUS_OK;
}